

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void add_inout_reloads(gen_ctx_t gen_ctx,MIR_insn_t insn)

{
  MIR_context_t ctx;
  MIR_op_mode_t MVar1;
  MIR_op_mode_t MVar2;
  MIR_reg_t var;
  size_t sVar3;
  MIR_type_t type;
  int out_p;
  undefined1 local_58 [16];
  anon_union_32_12_57d33f68_for_u aStack_48;
  
  ctx = gen_ctx->ctx;
  sVar3 = MIR_insn_nops(ctx,insn);
  if (((sVar3 < 2) || (*(int *)&insn->field_0x18 == 0xab)) ||
     (*(int *)&insn->field_0x18 - 0xa7U < 3)) {
    __assert_fail("MIR_insn_nops (ctx, insn) >= 2 && !MIR_call_code_p (insn->code) && insn->code != MIR_RET"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1b93,"void add_inout_reloads(gen_ctx_t, MIR_insn_t)");
  }
  MIR_insn_op_mode(ctx,insn,1,&out_p);
  if (out_p != 0) {
    __assert_fail("!out_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1b95,"void add_inout_reloads(gen_ctx_t, MIR_insn_t)");
  }
  MVar1 = MIR_insn_op_mode(ctx,insn,0,&out_p);
  if (((out_p != 0) && (MVar2 = MIR_insn_op_mode(ctx,insn,1,&out_p), MVar1 == MVar2)) &&
     (out_p == 0)) {
    if (MVar1 == MIR_OP_FLOAT) {
      type = MIR_T_F;
    }
    else if (MVar1 == MIR_OP_DOUBLE) {
      type = MIR_T_D;
    }
    else {
      type = (uint)(MVar1 == MIR_OP_LDOUBLE) * 4 + MIR_T_I64;
    }
    var = gen_new_temp_reg(gen_ctx,type,(gen_ctx->curr_func_item->u).func);
    _MIR_new_var_op(ctx,var);
    add_reload(gen_ctx,insn,(MIR_op_t *)(insn + 1),(MIR_op_t *)local_58,type,0);
    add_reload(gen_ctx,insn,insn->ops,(MIR_op_t *)local_58,type,1);
    insn[1].insn_link.next = (MIR_insn_t)aStack_48.i;
    *(char **)&insn[1].field_0x18 = aStack_48.str.s;
    insn[1].ops[0].data = (void *)aStack_48._16_8_;
    *(MIR_disp_t *)&insn[1].ops[0].field_0x8 = aStack_48.mem.disp;
    insn[1].data = (void *)local_58._0_8_;
    insn[1].insn_link.prev = (MIR_insn_t)local_58._8_8_;
    insn[1].insn_link.next = (MIR_insn_t)aStack_48.i;
    *(char **)&insn[1].field_0x18 = aStack_48.str.s;
    insn->ops[0].data = (void *)local_58._0_8_;
    *(undefined8 *)&insn->ops[0].field_0x8 = local_58._8_8_;
    insn->ops[0].u.i = aStack_48.i;
    insn->ops[0].u.str.s = aStack_48.str.s;
    insn->ops[0].u.i = aStack_48.i;
    insn->ops[0].u.str.s = aStack_48.str.s;
    *(undefined8 *)((long)&insn->ops[0].u + 0x10) = aStack_48._16_8_;
    insn->ops[0].u.mem.disp = aStack_48.mem.disp;
    return;
  }
  __assert_fail("out_p && mode == MIR_insn_op_mode (ctx, insn, 1, &out_p) && !out_p",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1b97,"void add_inout_reloads(gen_ctx_t, MIR_insn_t)");
}

Assistant:

static void add_inout_reloads (gen_ctx_t gen_ctx, MIR_insn_t insn) {
  MIR_context_t ctx = gen_ctx->ctx;
  int out_p;
  MIR_op_mode_t mode;
  MIR_type_t type;
  MIR_reg_t temp_reg;
  MIR_op_t temp_op;

  gen_assert (MIR_insn_nops (ctx, insn) >= 2 && !MIR_call_code_p (insn->code)
              && insn->code != MIR_RET);
  MIR_insn_op_mode (ctx, insn, 1, &out_p);
  gen_assert (!out_p);
  mode = MIR_insn_op_mode (ctx, insn, 0, &out_p);
  gen_assert (out_p && mode == MIR_insn_op_mode (ctx, insn, 1, &out_p) && !out_p);
  type = mode2type (mode);
  temp_reg = gen_new_temp_reg (gen_ctx, type, curr_func_item->u.func);
  temp_op = _MIR_new_var_op (ctx, temp_reg);
  add_reload (gen_ctx, insn, &insn->ops[1], &temp_op, type, FALSE);
  add_reload (gen_ctx, insn, &insn->ops[0], &temp_op, type, TRUE);
  insn->ops[0] = insn->ops[1] = temp_op;
}